

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ReceptiveFieldDecodingSynapse.cpp
# Opt level: O3

void __thiscall ReceptiveFieldDecodingSynapse::update(ReceptiveFieldDecodingSynapse *this)

{
  double dVar1;
  double dVar2;
  ulong uVar3;
  double *pdVar4;
  Population *pPVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  uint uVar8;
  ulong uVar9;
  long lVar10;
  long lVar11;
  double dVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  
  dVar1 = this->currentWindow;
  dVar2 = this->param->window_length_s;
  dVar12 = Clock::getCurrentTime(this->clock);
  if (dVar1 + dVar2 <= dVar12) {
    uVar3 = (this->spikeTimes).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
            m_storage.m_rows;
    if ((long)uVar3 < 0) {
      __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/haukri[P]MasterProject/Eigen/src/Core/CwiseNullaryOp.h"
                    ,0x4a,
                    "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = Eigen::Matrix<double, -1, 1>]"
                   );
    }
    pdVar4 = (this->spikeTimes).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
             m_storage.m_data;
    if (1 < uVar3) {
      uVar9 = 0;
      do {
        pdVar4[uVar9] = -1.0;
        (pdVar4 + uVar9)[1] = -1.0;
        uVar9 = uVar9 + 2;
      } while (uVar9 < (uVar3 & 0x7ffffffffffffffe));
    }
    auVar7 = _DAT_00118030;
    auVar6 = _DAT_00118020;
    if ((long)(uVar3 & 0x7ffffffffffffffe) < (long)uVar3) {
      uVar8 = (uint)uVar3 & 1;
      lVar10 = (ulong)uVar8 - 1;
      auVar13._8_4_ = (int)lVar10;
      auVar13._0_8_ = lVar10;
      auVar13._12_4_ = (int)((ulong)lVar10 >> 0x20);
      uVar9 = 0;
      auVar13 = auVar13 ^ _DAT_00118030;
      do {
        auVar14._8_4_ = (int)uVar9;
        auVar14._0_8_ = uVar9;
        auVar14._12_4_ = (int)(uVar9 >> 0x20);
        auVar14 = (auVar14 | auVar6) ^ auVar7;
        if ((bool)(~(auVar14._4_4_ == auVar13._4_4_ && auVar13._0_4_ < auVar14._0_4_ ||
                    auVar13._4_4_ < auVar14._4_4_) & 1)) {
          pdVar4[(uVar3 & 0xfffffffffffffffe) + uVar9] = -1.0;
        }
        if ((auVar14._12_4_ != auVar13._12_4_ || auVar14._8_4_ <= auVar13._8_4_) &&
            auVar14._12_4_ <= auVar13._12_4_) {
          pdVar4[(uVar3 & 0xfffffffffffffffe) + uVar9 + 1] = -1.0;
        }
        uVar9 = uVar9 + 2;
      } while ((uVar8 + 1 & 0xfffffffe) != uVar9);
    }
    this->currentWindow = this->param->window_length_s + this->currentWindow;
    this->earliestSpike = false;
  }
  lVar10 = (this->spikeTimes).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
           m_storage.m_rows;
  if (0 < lVar10) {
    lVar11 = 0;
    do {
      pdVar4 = (this->spikeTimes).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
               m_storage.m_data + lVar11;
      if (((*pdVar4 <= 0.0 && *pdVar4 != 0.0) &&
          ((((this->super_Synapse).from_population)->output).
           super__Vector_base<Event_*,_std::allocator<Event_*>_>._M_impl.super__Vector_impl_data.
           _M_start[lVar11]->type == Spike)) && (this->earliestSpike == false)) {
        (*(this->output).super__Vector_base<Event_*,_std::allocator<Event_*>_>._M_impl.
          super__Vector_impl_data._M_start)[1]._vptr_Event =
             (_func_int **)((double)(int)lVar11 * this->outputStep);
        pPVar5 = (this->super_Synapse).to_population;
        (*pPVar5->_vptr_Population[5])(pPVar5,0);
        this->earliestSpike = true;
        lVar10 = (this->spikeTimes).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                 m_storage.m_rows;
      }
      lVar11 = lVar11 + 1;
    } while (lVar11 < lVar10);
  }
  Logging::logValue(this->logger,(long)this,0,3,
                    (double)(*(this->output).super__Vector_base<Event_*,_std::allocator<Event_*>_>.
                              _M_impl.super__Vector_impl_data._M_start)[1]._vptr_Event);
  return;
}

Assistant:

void ReceptiveFieldDecodingSynapse::update() {
    if(currentWindow + param->window_length_s <= clock->getCurrentTime()) {
        spikeTimes.setConstant(-1);
        currentWindow += param->window_length_s;
        earliestSpike = false;
    }
    for(int j = 0; j < spikeTimes.size(); j++) {
        if(spikeTimes(j) < 0 && from_population->output[j]->type == EventType::Spike && !earliestSpike) {
            double outputValue = j * outputStep;
            static_cast<ValueEvent*>(output[0])->setValue(outputValue);
            to_population->setInput(0, output[0]);
            earliestSpike = true;
        }
    }
    logger->logValue((long)this, 0, EventType::Value, static_cast<ValueEvent*>(output[0])->value);
}